

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O1

QChar * QIPAddressUtils::parseIp6(IPv6Address *address,QChar *begin,QChar *end)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QChar *pQVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  QChar *pQVar12;
  char *pcVar13;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar14;
  IPv4Address ip4;
  Buffer buffer;
  IPv4Address local_9c;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = 0x40;
  local_98._8_8_ = 0;
  local_98._16_8_ = local_98 + 0x18;
  pQVar7 = checkedToAscii((Buffer *)local_98,begin,end);
  uVar3 = local_98._16_8_;
  uVar2 = local_98._8_8_;
  pQVar12 = pQVar7;
  if (pQVar7 == (QChar *)0x0) {
    iVar11 = 0;
    iVar9 = 0;
    pcVar13 = (char *)local_98._16_8_;
    do {
      cVar1 = *pcVar13;
      if (cVar1 == ':') {
        iVar11 = iVar11 + 1;
      }
      else if (cVar1 == '\0') goto LAB_00248d88;
      iVar9 = iVar9 + (uint)(cVar1 == '.');
      pcVar13 = pcVar13 + 1;
    } while( true );
  }
  goto LAB_00248f4b;
LAB_00248d88:
  pQVar12 = end;
  if ((iVar9 == 3) || (iVar9 == 0)) {
    *(quint8 *)((long)address + 0) = '\0';
    *(quint8 *)((long)address + 1) = '\0';
    *(quint8 *)((long)address + 2) = '\0';
    *(quint8 *)((long)address + 3) = '\0';
    *(quint8 *)((long)address + 4) = '\0';
    *(quint8 *)((long)address + 5) = '\0';
    *(quint8 *)((long)address + 6) = '\0';
    *(quint8 *)((long)address + 7) = '\0';
    *(quint8 *)((long)address + 8) = '\0';
    *(quint8 *)((long)address + 9) = '\0';
    *(quint8 *)((long)address + 10) = '\0';
    *(quint8 *)((long)address + 0xb) = '\0';
    *(quint8 *)((long)address + 0xc) = '\0';
    *(quint8 *)((long)address + 0xd) = '\0';
    *(quint8 *)((long)address + 0xe) = '\0';
    *(quint8 *)((long)address + 0xf) = '\0';
    if ((long)end - (long)begin == 4 && iVar11 == 2) {
      pQVar12 = (QChar *)0x0;
    }
    else if ((((*(char *)local_98._16_8_ == ':') &&
              (iVar5 = 9, *(char *)(local_98._16_8_ + 1) == ':')) ||
             ((lVar8 = (long)end - (long)begin >> 1, *(char *)(local_98._16_8_ + lVar8 + -2) == ':'
              && (iVar5 = 9, *(char *)(local_98._16_8_ + lVar8 + -1) == ':')))) ||
            (iVar5 = 8, 0xfffffff9 < iVar11 - 8U)) {
      iVar10 = 0;
      iVar5 = (-iVar11 - (uint)(iVar9 != 0)) + iVar5;
      pcVar13 = (char *)local_98._16_8_;
      do {
        while( true ) {
          if (0xe < iVar10) goto LAB_00248f3d;
          if (*pcVar13 != ':') break;
          if (iVar5 < 1) {
LAB_00248f87:
            pQVar12 = begin + ((long)pcVar13 - local_98._16_8_);
            goto LAB_00248f4b;
          }
          if (iVar10 == iVar11 * 2 || iVar10 == 0) {
            if (pcVar13[1] != ':') goto LAB_00248f87;
            pcVar13 = pcVar13 + 1;
          }
          iVar10 = iVar10 + iVar5 * 2;
          pcVar13 = pcVar13 + 1;
          iVar5 = 0;
        }
        QVar14 = qstrntoull(pcVar13,(qsizetype)(uVar3 + (uVar2 - (long)pcVar13)),0x10);
        lVar8 = QVar14.used;
        if (lVar8 - 5U < 0xfffffffffffffffc) {
LAB_00248e4e:
          pQVar7 = begin + ((long)pcVar13 - local_98._16_8_);
          iVar9 = iVar10;
LAB_00248e5a:
          iVar6 = 1;
          iVar10 = iVar9;
        }
        else {
          if (pcVar13[lVar8] == '.') {
            if (iVar10 != 0xc) goto LAB_00248e4e;
            local_9c = 0xaaaaaaaa;
            bVar4 = parseIp4Internal(&local_9c,pcVar13,false);
            if (bVar4) {
              *(IPv4Address *)(*address + 0xc) =
                   local_9c >> 0x18 | (local_9c & 0xff0000) >> 8 | (local_9c & 0xff00) << 8 |
                   local_9c << 0x18;
              pQVar7 = (QChar *)0x0;
            }
            else {
              pQVar7 = begin + ((long)pcVar13 - local_98._16_8_);
            }
            iVar9 = 0xc;
            goto LAB_00248e5a;
          }
          (*address)[iVar10] = QVar14.result._1_1_;
          iVar9 = iVar10 + 2;
          (*address)[(long)iVar10 + 1] = (quint8)QVar14.result;
          cVar1 = pcVar13[lVar8];
          iVar10 = iVar9;
          if (cVar1 == '\0') {
            iVar6 = 5;
          }
          else {
            if (cVar1 != ':') {
              pQVar7 = begin + ((long)(pcVar13 + lVar8) - local_98._16_8_);
              goto LAB_00248e5a;
            }
            pcVar13 = pcVar13 + lVar8 + 1;
            iVar6 = 0;
          }
        }
      } while (iVar6 == 0);
      pQVar12 = pQVar7;
      if (iVar6 == 5) {
LAB_00248f3d:
        pQVar12 = end;
        if (iVar10 == 0x10) {
          pQVar12 = (QChar *)0x0;
        }
      }
    }
  }
LAB_00248f4b:
  if ((undefined1 *)local_98._16_8_ != local_98 + 0x18) {
    QtPrivate::sizedFree((void *)local_98._16_8_,local_98._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar12;
}

Assistant:

const QChar *parseIp6(IPv6Address &address, const QChar *begin, const QChar *end)
{
    Q_ASSERT(begin != end);
    Buffer buffer;
    const QChar *ret = checkedToAscii(buffer, begin, end);
    if (ret)
        return ret;

    const char *ptr = buffer.data();
    const char *const stop = ptr + buffer.size();

    // count the colons
    int colonCount = 0;
    int dotCount = 0;
    while (*ptr) {
        if (*ptr == ':')
            ++colonCount;
        if (*ptr == '.')
            ++dotCount;
        ++ptr;
    }
    // IPv4-in-IPv6 addresses are stricter in what they accept
    if (dotCount != 0 && dotCount != 3)
        return end;

    memset(address, 0, sizeof address);
    if (colonCount == 2 && end - begin == 2) // "::"
        return nullptr;

    // if there's a double colon ("::"), this is how many zeroes it means
    int zeroWordsToFill;
    ptr = buffer.data();

    // there are two cases where 8 colons are allowed: at the ends
    // so test that before the colon-count test
    if ((ptr[0] == ':' && ptr[1] == ':') ||
            (ptr[end - begin - 2] == ':' && ptr[end - begin - 1] == ':')) {
        zeroWordsToFill = 9 - colonCount;
    } else if (colonCount < 2 || colonCount > 7) {
        return end;
    } else {
        zeroWordsToFill = 8 - colonCount;
    }
    if (dotCount)
        --zeroWordsToFill;

    int pos = 0;
    while (pos < 15) {
        if (*ptr == ':') {
            // empty field, we hope it's "::"
            if (zeroWordsToFill < 1)
                return begin + (ptr - buffer.data());
            if (pos == 0 || pos == colonCount * 2) {
                if (ptr[0] == '\0' || ptr[1] != ':')
                    return begin + (ptr - buffer.data());
                ++ptr;
            }
            pos += zeroWordsToFill * 2;
            zeroWordsToFill = 0;
            ++ptr;
            continue;
        }

        auto [ll, used] = qstrntoull(ptr, stop - ptr, 16);
        quint16 x = ll;

        // Reject malformed fields:
        // - failed to parse
        // - too many hex digits
        if (used <= 0 || used > 4)
            return begin + (ptr - buffer.data());

        if (ptr[used] == '.') {
            // this could be an IPv4 address
            // it's only valid in the last element
            if (pos != 12)
                return begin + (ptr - buffer.data());

            IPv4Address ip4;
            if (!parseIp4Internal(ip4, ptr, false))
                return begin + (ptr - buffer.data());

            address[12] = ip4 >> 24;
            address[13] = ip4 >> 16;
            address[14] = ip4 >> 8;
            address[15] = ip4;
            return nullptr;
        }

        address[pos++] = x >> 8;
        address[pos++] = x & 0xff;

        if (ptr[used] == '\0')
            break;
        if (ptr[used] != ':')
            return begin + (used + ptr - buffer.data());
        ptr += used + 1;
    }
    return pos == 16 ? nullptr : end;
}